

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void highbd_transpose4x8_8x4_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3,__m128i *d4,__m128i *d5,__m128i *d6,__m128i *d7)

{
  undefined4 uVar1;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined1 auVar8 [16];
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  
  highbd_transpose4x8_8x4_low_sse2(x0,x1,x2,x3,d0,d1,d2,d3);
  uVar1 = CONCAT22((short)(*x1)[1],(short)(*x0)[1]);
  auVar2._0_8_ = CONCAT26(*(undefined2 *)((long)*x1 + 10),
                          CONCAT24(*(undefined2 *)((long)*x0 + 10),uVar1));
  auVar2._8_2_ = *(undefined2 *)((long)*x0 + 0xc);
  auVar2._10_2_ = *(undefined2 *)((long)*x1 + 0xc);
  auVar3._12_2_ = *(undefined2 *)((long)*x0 + 0xe);
  auVar3._0_12_ = auVar2;
  auVar3._14_2_ = *(undefined2 *)((long)*x1 + 0xe);
  uVar5 = CONCAT22((short)(*x3)[1],(short)(*x2)[1]);
  auVar6._0_8_ = CONCAT26(*(undefined2 *)((long)*x3 + 10),
                          CONCAT24(*(undefined2 *)((long)*x2 + 10),uVar5));
  auVar6._8_2_ = *(undefined2 *)((long)*x2 + 0xc);
  auVar6._10_2_ = *(undefined2 *)((long)*x3 + 0xc);
  auVar7._12_2_ = *(undefined2 *)((long)*x2 + 0xe);
  auVar7._0_12_ = auVar6;
  auVar7._14_2_ = *(undefined2 *)((long)*x3 + 0xe);
  auVar8._8_4_ = (int)((ulong)auVar2._0_8_ >> 0x20);
  auVar8._0_8_ = auVar2._0_8_;
  auVar8._12_4_ = (int)((ulong)auVar6._0_8_ >> 0x20);
  auVar4._0_8_ = CONCAT44(auVar6._8_4_,auVar2._8_4_);
  auVar4._8_4_ = auVar3._12_4_;
  auVar4._12_4_ = auVar7._12_4_;
  (*d4)[0] = CONCAT44(uVar5,uVar1);
  (*d4)[1] = 0;
  (*d5)[0] = auVar8._8_8_;
  (*d5)[1] = 0;
  (*d6)[0] = auVar4._0_8_;
  (*d6)[1] = 0;
  *d7 = (__m128i)(auVar4 >> 0x40);
  return;
}

Assistant:

static inline void highbd_transpose4x8_8x4_sse2(__m128i *x0, __m128i *x1,
                                                __m128i *x2, __m128i *x3,
                                                __m128i *d0, __m128i *d1,
                                                __m128i *d2, __m128i *d3,
                                                __m128i *d4, __m128i *d5,
                                                __m128i *d6, __m128i *d7) {
  // input
  // x0 00 01 02 03 04 05 06 07
  // x1 10 11 12 13 14 15 16 17
  // x2 20 21 22 23 24 25 26 27
  // x3 30 31 32 33 34 35 36 37
  // output
  // 00 10 20 30 xx xx xx xx
  // 01 11 21 31 xx xx xx xx
  // 02 12 22 32 xx xx xx xx
  // 03 13 23 33 xx xx xx xx
  // 04 14 24 34 xx xx xx xx
  // 05 15 25 35 xx xx xx xx
  // 06 16 26 36 xx xx xx xx
  // 07 17 27 37 xx xx xx xx
  highbd_transpose4x8_8x4_low_sse2(x0, x1, x2, x3, d0, d1, d2, d3);
  highbd_transpose4x8_8x4_high_sse2(x0, x1, x2, x3, d4, d5, d6, d7);
}